

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_encoder.hpp
# Opt level: O1

bool __thiscall
jsoncons::
basic_compact_json_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
::visit_key(basic_compact_json_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
            *this,string_view_type *name,ser_context *param_2,error_code *param_3)

{
  byte bVar1;
  pointer peVar2;
  
  peVar2 = (this->stack_).
           super__Vector_base<jsoncons::basic_compact_json_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_compact_json_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>::encoding_context>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (((this->stack_).
       super__Vector_base<jsoncons::basic_compact_json_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_compact_json_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>::encoding_context>_>
       ._M_impl.super__Vector_impl_data._M_start != peVar2) && (peVar2[-1].count_ != 0)) {
    std::__cxx11::string::push_back((char)(this->sink_).buf_ptr);
  }
  std::__cxx11::string::push_back((char)(this->sink_).buf_ptr);
  bVar1 = (this->options_).field_0x8;
  detail::escape_string<char,jsoncons::string_sink<std::__cxx11::string>>
            (name->_M_str,name->_M_len,(bool)(bVar1 & 1),(bool)((bVar1 & 2) >> 1),&this->sink_);
  std::__cxx11::string::push_back((char)(this->sink_).buf_ptr);
  std::__cxx11::string::push_back((char)(this->sink_).buf_ptr);
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_key(const string_view_type& name, const ser_context&, std::error_code&) final
        {
            if (!stack_.empty() && stack_.back().count() > 0)
            {
                sink_.push_back(',');
            }

            sink_.push_back('\"');
            jsoncons::detail::escape_string(name.data(), name.length(),options_.escape_all_non_ascii(),options_.escape_solidus(),sink_);
            sink_.push_back('\"');
            sink_.push_back(':');
            JSONCONS_VISITOR_RETURN;
        }